

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

int coda_ascii_cursor_read_double(coda_cursor_conflict *cursor,double *dst)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  coda_type *local_90;
  int local_84;
  long lStack_80;
  int has_dynamic_size;
  long buffer_size;
  char buffer [64];
  int64_t bit_size_boundary;
  int64_t bit_offset;
  coda_type_number *type;
  double *dst_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_90 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_90 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  uVar1 = cursor->stack[cursor->n + -1].bit_offset;
  local_84 = 1;
  iVar2 = get_bit_size_boundary(cursor,(int64_t *)(buffer + 0x38),local_90->bit_size);
  if (iVar2 == 0) {
    if ((uVar1 & 7) == 0) {
      if (local_90->bit_size < 0) {
        lStack_80 = (long)buffer._56_8_ >> 3;
        if (0x3f < lStack_80) {
          lStack_80 = 0x40;
        }
      }
      else {
        local_84 = 0;
        lStack_80 = local_90->bit_size >> 3;
        if (0x40 < lStack_80) {
          __assert_fail("buffer_size <= MAX_ASCII_NUMBER_LENGTH",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                        ,0x523,"int coda_ascii_cursor_read_double(const coda_cursor *, double *)");
        }
      }
      iVar2 = read_bytes_in_bounds(cursor->product,(long)uVar1 >> 3,lStack_80,&buffer_size);
      if (iVar2 == 0) {
        if ((local_90[1].description == (char *)0x0) ||
           (iVar2 = parse_float_mapping((char *)&buffer_size,lStack_80,
                                        (coda_ascii_mappings *)local_90[1].description,local_84,dst)
           , iVar2 == 0)) {
          lVar3 = coda_ascii_parse_double((char *)&buffer_size,lStack_80,dst,local_84);
          if (lVar3 < 0) {
            cursor_local._4_4_ = -1;
          }
          else {
            cursor_local._4_4_ = 0;
          }
        }
        else if (iVar2 == 1) {
          cursor_local._4_4_ = 0;
        }
        else {
          cursor_local._4_4_ = -1;
        }
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      coda_set_error(-0x16,"reading of ascii data does not start at byte boundary");
      cursor_local._4_4_ = -1;
    }
  }
  else {
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascii_cursor_read_double(const coda_cursor *cursor, double *dst)
{
    coda_type_number *type = (coda_type_number *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t bit_size_boundary;
    char buffer[MAX_ASCII_NUMBER_LENGTH];
    long buffer_size;
    int has_dynamic_size = 1;

    if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
    {
        return -1;
    }

    if (bit_offset & 0x7)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "reading of ascii data does not start at byte boundary");
        return -1;
    }

    if (type->bit_size >= 0)
    {
        has_dynamic_size = 0;
        buffer_size = (long)(type->bit_size >> 3);
        assert(buffer_size <= MAX_ASCII_NUMBER_LENGTH);
    }
    else if (bit_size_boundary >> 3 < MAX_ASCII_NUMBER_LENGTH)
    {
        buffer_size = (long)(bit_size_boundary >> 3);
    }
    else
    {
        buffer_size = MAX_ASCII_NUMBER_LENGTH;
    }

    if (read_bytes_in_bounds(cursor->product, bit_offset >> 3, buffer_size, buffer) != 0)
    {
        return -1;
    }
    if (type->mappings != NULL)
    {
        switch (parse_float_mapping(buffer, buffer_size, type->mappings, has_dynamic_size, dst))
        {
            case 0:
                /* no mapping applied */
                break;
            case 1:
                /* applicable mapping found */
                return 0;
            default:
                return -1;
        }
    }
    if (coda_ascii_parse_double(buffer, buffer_size, dst, has_dynamic_size) < 0)
    {
        return -1;
    }

    return 0;
}